

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O0

VisitReturn __thiscall
QMakeEvaluator::evaluateFeatureFile(QMakeEvaluator *this,QString *fileName,bool silent)

{
  QLatin1StringView s;
  bool bVar1;
  ulong uVar2;
  QString *this_00;
  QMakeFeatureRoots *pQVar3;
  qsizetype qVar4;
  QMakeEvaluator *data;
  byte in_DL;
  QMakeEvaluator *in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  VisitReturn ok;
  ProStringList *already;
  int root_1;
  int root;
  QStringList *paths;
  int start_root;
  QString *fnp;
  ProString afn;
  QString fname;
  QStringView currPath;
  QString currFn;
  QString fn;
  undefined4 in_stack_fffffffffffffd68;
  LoadFlag in_stack_fffffffffffffd6c;
  QMakeEvaluator *in_stack_fffffffffffffd70;
  QMakeEvaluator *in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd80;
  int in_stack_fffffffffffffd84;
  int fieldWidth;
  undefined4 in_stack_fffffffffffffd88;
  int in_stack_fffffffffffffd8c;
  ProKey *in_stack_fffffffffffffd90;
  QMakeEvaluator *in_stack_fffffffffffffd98;
  EvalFileType type;
  undefined4 in_stack_fffffffffffffdb8;
  undefined2 in_stack_fffffffffffffdbc;
  QChar in_stack_fffffffffffffdbe;
  QMakeEvaluator *this_01;
  int local_234;
  int local_230;
  int local_22c;
  int local_21c;
  VisitReturn local_1f4;
  QChar local_1ea;
  storage_type *local_1e8;
  QMakeEvaluator *in_stack_fffffffffffffe28;
  undefined1 local_1a8 [4];
  QFlagsStorage<QMakeEvaluator::LoadFlag> in_stack_fffffffffffffe5c;
  QChar local_142;
  storage_type *local_140;
  undefined1 local_130 [48];
  QLatin1String *local_100;
  QStringBuilder<const_QString_&,_QString_&> local_f0;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  QStringView local_b8;
  QStringView local_78;
  QStringView local_68;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  CaseSensitivity local_30;
  QString local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_20.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_20.d.size = -0x5555555555555556;
  QString::QString((QString *)in_stack_fffffffffffffd70,
                   (QString *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  QLatin1String::QLatin1String
            ((QLatin1String *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
             (char *)in_stack_fffffffffffffd78);
  uVar2 = QString::endsWith((QLatin1String *)&local_20,local_30);
  local_234 = in_stack_fffffffffffffd8c;
  if ((uVar2 & 1) == 0) {
    QLatin1String::QLatin1String
              ((QLatin1String *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
               (char *)in_stack_fffffffffffffd78);
    s.m_size._4_4_ = in_stack_fffffffffffffd84;
    s.m_size._0_4_ = in_stack_fffffffffffffd80;
    s.m_data._0_4_ = in_stack_fffffffffffffd88;
    s.m_data._4_4_ = in_stack_fffffffffffffd8c;
    QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),s);
    local_234 = in_stack_fffffffffffffd8c;
  }
  bVar1 = QExplicitlySharedDataPointer<QMakeFeatureRoots>::operator!
                    ((QExplicitlySharedDataPointer<QMakeFeatureRoots> *)0x2f9132);
  if (bVar1) {
    updateFeaturePaths(in_stack_fffffffffffffe28);
  }
  local_58 = 0xaaaaaaaaaaaaaaaa;
  local_50 = 0xaaaaaaaaaaaaaaaa;
  local_48 = 0xaaaaaaaaaaaaaaaa;
  currentFileName(in_stack_fffffffffffffd78);
  local_68 = QMakeInternal::IoUtils::fileName
                       ((QString *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
  local_78 = QMakeInternal::IoUtils::fileName
                       ((QString *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
  bVar1 = ::operator!=((QStringView *)in_stack_fffffffffffffd70,
                       (QStringView *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68))
  ;
  if (bVar1) {
    QString::clear((QString *)in_stack_fffffffffffffd70);
  }
  QExplicitlySharedDataPointer<QMakeFeatureRoots>::operator->
            ((QExplicitlySharedDataPointer<QMakeFeatureRoots> *)0x2f91f4);
  qMakePair<QString&,QString&>
            ((QString *)in_stack_fffffffffffffd78,(QString *)in_stack_fffffffffffffd70);
  this_00 = QHash<std::pair<QString,_QString>,_QString>::operator[]
                      ((QHash<std::pair<QString,_QString>,_QString> *)
                       CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                       (pair<QString,_QString> *)in_stack_fffffffffffffd78);
  std::pair<QString,_QString>::~pair((pair<QString,_QString> *)in_stack_fffffffffffffd70);
  bVar1 = QString::isNull((QString *)0x2f9258);
  type = (EvalFileType)((ulong)in_RDI >> 0x20);
  if (bVar1) {
    local_21c = 0;
    pQVar3 = QExplicitlySharedDataPointer<QMakeFeatureRoots>::operator->
                       ((QExplicitlySharedDataPointer<QMakeFeatureRoots> *)0x2f9289);
    bVar1 = QString::isEmpty((QString *)0x2f929f);
    if (!bVar1) {
      local_b8.m_data = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
      local_b8.m_size = 0xaaaaaaaaaaaaaaaa;
      local_b8 = QMakeInternal::IoUtils::pathName
                           ((QString *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80)
                           );
      local_22c = 0;
      while( true ) {
        in_stack_fffffffffffffd98 = (QMakeEvaluator *)(long)local_22c;
        qVar4 = QList<QString>::size(&pQVar3->paths);
        if (qVar4 <= (long)in_stack_fffffffffffffd98) break;
        QList<QString>::at((QList<QString> *)in_stack_fffffffffffffd70,
                           CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
        QStringView::QStringView<QString,_true>
                  ((QStringView *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                   (QString *)in_stack_fffffffffffffd78);
        bVar1 = ::operator==((QStringView *)in_stack_fffffffffffffd70,
                             (QStringView *)
                             CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
        if (bVar1) {
          local_21c = local_22c + 1;
          break;
        }
        local_22c = local_22c + 1;
      }
    }
    local_230 = local_21c;
    while( true ) {
      in_stack_fffffffffffffd90 = (ProKey *)(long)local_230;
      qVar4 = QList<QString>::size(&pQVar3->paths);
      type = (EvalFileType)((ulong)in_RDI >> 0x20);
      if (qVar4 <= (long)in_stack_fffffffffffffd90) break;
      local_e0 = 0xaaaaaaaaaaaaaaaa;
      local_d8 = 0xaaaaaaaaaaaaaaaa;
      local_d0 = 0xaaaaaaaaaaaaaaaa;
      QList<QString>::at((QList<QString> *)in_stack_fffffffffffffd70,
                         CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      local_f0 = ::operator+((QString *)in_stack_fffffffffffffd70,
                             (QString *)
                             CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<const_QString_&,_QString_&> *)
                 CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      bVar1 = QMakeInternal::IoUtils::exists((QString *)0x2f940e);
      if (bVar1) {
        QString::operator=(&local_20,(QString *)&local_e0);
        local_234 = 8;
      }
      else {
        local_234 = 0;
      }
      QString::~QString((QString *)0x2f9448);
      type = (EvalFileType)((ulong)in_RDI >> 0x20);
      if (local_234 != 0) {
        if (local_234 != 8) goto LAB_002f9774;
        goto LAB_002f94a7;
      }
      local_230 = local_230 + 1;
    }
    QLatin1String::QLatin1String
              ((QLatin1String *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
               (char *)in_stack_fffffffffffffd78);
    QString::operator=(&local_20,local_100);
LAB_002f94a7:
    QString::operator=(this_00,(QString *)&local_20);
  }
  else {
    QString::operator=(&local_20,(QString *)this_00);
  }
  bVar1 = QString::isEmpty((QString *)0x2f94e0);
  if (bVar1) {
    if ((in_DL & 1) == 0) {
      QByteArrayView::QByteArrayView<23ul>
                ((QByteArrayView *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                 (char (*) [23])in_stack_fffffffffffffd78);
      QVar5.m_data = local_140;
      QVar5.m_size = (qsizetype)local_130;
      QString::fromLatin1(QVar5);
      fieldWidth = (int)((ulong)in_RSI >> 0x20);
      QChar::QChar<char16_t,_true>(&local_142,L' ');
      QString::arg<QString,_true>
                ((QString *)in_stack_fffffffffffffd90,
                 (QString *)CONCAT44(local_234,in_stack_fffffffffffffd88),fieldWidth,
                 in_stack_fffffffffffffdbe);
      evalError(in_stack_fffffffffffffd70,
                (QString *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      QString::~QString((QString *)0x2f958b);
      QString::~QString((QString *)0x2f9598);
    }
    local_1f4 = ReturnFalse;
  }
  else {
    ProKey::ProKey((ProKey *)in_stack_fffffffffffffd70,
                   (char *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    data = (QMakeEvaluator *)valuesRef(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
    ProKey::~ProKey((ProKey *)0x2f95f7);
    this_01 = data;
    memset(local_1a8,0xaa,0x30);
    ProString::ProString
              ((ProString *)in_stack_fffffffffffffd70,
               (QString *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    bVar1 = ProStringList::contains
                      ((ProStringList *)CONCAT44(local_234,in_stack_fffffffffffffd88),
                       (ProString *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                       (CaseSensitivity)((ulong)data >> 0x20));
    if (bVar1) {
      if ((in_DL & 1) == 0) {
        QByteArrayView::QByteArrayView<28ul>
                  ((QByteArrayView *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                   (char (*) [28])data);
        QVar6.m_data = local_1e8;
        QVar6.m_size = (qsizetype)&stack0xfffffffffffffe28;
        QString::fromLatin1(QVar6);
        QChar::QChar<char16_t,_true>(&local_1ea,L' ');
        QString::arg<QString,_true>
                  ((QString *)in_stack_fffffffffffffd90,
                   (QString *)CONCAT44(local_234,in_stack_fffffffffffffd88),
                   in_stack_fffffffffffffd84,in_stack_fffffffffffffdbe);
        languageWarning(in_RSI,(QString *)
                               CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
        QString::~QString((QString *)0x2f96ef);
        QString::~QString((QString *)0x2f96fc);
      }
      local_1f4 = ReturnTrue;
    }
    else {
      QList<ProString>::append
                ((QList<ProString> *)in_stack_fffffffffffffd70,
                 (parameter_type)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      QFlags<QMakeEvaluator::LoadFlag>::QFlags
                ((QFlags<QMakeEvaluator::LoadFlag> *)in_stack_fffffffffffffd70,
                 in_stack_fffffffffffffd6c);
      local_1f4 = evaluateFile(this_01,(QString *)
                                       CONCAT26(in_stack_fffffffffffffdbe.ucs,
                                                CONCAT24(in_stack_fffffffffffffdbc,
                                                         in_stack_fffffffffffffdb8)),type,
                               (LoadFlags)in_stack_fffffffffffffe5c.i);
    }
    ProString::~ProString((ProString *)0x2f9774);
  }
LAB_002f9774:
  QString::~QString((QString *)0x2f9781);
  QString::~QString((QString *)0x2f978e);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_1f4;
}

Assistant:

QMakeEvaluator::VisitReturn QMakeEvaluator::evaluateFeatureFile(
        const QString &fileName, bool silent)
{
    QString fn = fileName;
    if (!fn.endsWith(QLatin1String(".prf")))
        fn += QLatin1String(".prf");

    if (!m_featureRoots)
        updateFeaturePaths();
#ifdef PROEVALUATOR_THREAD_SAFE
    m_featureRoots->mutex.lock();
#endif
    QString currFn = currentFileName();
    if (IoUtils::fileName(currFn) != IoUtils::fileName(fn))
        currFn.clear();
    // Null values cannot regularly exist in the hash, so they indicate that the value still
    // needs to be determined. Failed lookups are represented via non-null empty strings.
    QString *fnp = &m_featureRoots->cache[qMakePair(fn, currFn)];
    if (fnp->isNull()) {
#ifdef QMAKE_OVERRIDE_PRFS
        {
            QString ovrfn(QLatin1String(":/qmake/override_features/") + fn);
            if (QFileInfo::exists(ovrfn)) {
                fn = ovrfn;
                goto cool;
            }
        }
#endif
        {
            int start_root = 0;
            const QStringList &paths = m_featureRoots->paths;
            if (!currFn.isEmpty()) {
                QStringView currPath = IoUtils::pathName(currFn);
                for (int root = 0; root < paths.size(); ++root)
                    if (currPath == paths.at(root)) {
                        start_root = root + 1;
                        break;
                    }
            }
            for (int root = start_root; root < paths.size(); ++root) {
                QString fname = paths.at(root) + fn;
                if (IoUtils::exists(fname)) {
                    fn = fname;
                    goto cool;
                }
            }
        }
#ifdef QMAKE_BUILTIN_PRFS
        fn.prepend(QLatin1String(":/qmake/features/"));
        if (QFileInfo::exists(fn))
            goto cool;
#endif
        fn = QLatin1String(""); // Indicate failed lookup. See comment above.

      cool:
        *fnp = fn;
    } else {
        fn = *fnp;
    }
#ifdef PROEVALUATOR_THREAD_SAFE
    m_featureRoots->mutex.unlock();
#endif
    if (fn.isEmpty()) {
        if (!silent)
            evalError(fL1S("Cannot find feature %1").arg(fileName));
        return ReturnFalse;
    }
    ProStringList &already = valuesRef(ProKey("QMAKE_INTERNAL_INCLUDED_FEATURES"));
    ProString afn(fn);
    if (already.contains(afn)) {
        if (!silent)
            languageWarning(fL1S("Feature %1 already included").arg(fileName));
        return ReturnTrue;
    }
    already.append(afn);

#ifdef PROEVALUATOR_CUMULATIVE
    bool cumulative = m_cumulative;
    // Even when evaluating the project in cumulative mode to maximize the
    // chance of collecting all source declarations, prfs are evaluated in
    // exact mode to maximize the chance of them successfully executing
    // their programmatic function.
    m_cumulative = false;
#endif

    // The path is fully normalized already.
    VisitReturn ok = evaluateFile(fn, QMakeHandler::EvalFeatureFile, LoadProOnly);

#ifdef PROEVALUATOR_CUMULATIVE
    m_cumulative = cumulative;
    if (cumulative) {
        // As the data collected in cumulative mode is potentially total
        // garbage, yet the prfs fed with it are executed in exact mode,
        // we must ignore their results to avoid that evaluation is unduly
        // aborted.
        ok = ReturnTrue;
    }
#endif
    return ok;
}